

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

CSVError * __thiscall
duckdb::CSVError::LineSizeError
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          LinesPerBoundary error_info,string *csv_row,idx_t byte_position,string *current_path)

{
  long lVar1;
  LinesPerBoundary error_info_p;
  ostream *poVar2;
  ostringstream how_to_fix_it;
  ostringstream error;
  optional_idx local_398;
  CSVReaderOptions *local_390;
  idx_t iStack_388;
  string local_380;
  string local_360;
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Maximum line size of ",0x15);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes exceeded. ",0x11);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Actual Size:",0xc);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes.",7);
  local_320[0] = (ostringstream)0xa;
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_320,1);
  ::std::__cxx11::ostringstream::ostringstream(local_320);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "Possible Solution: Change the maximum length size, e.g., max_line_size=",0x47);
  poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_63f1717 + 8,1);
  ::std::__cxx11::stringbuf::str();
  lVar1 = *(long *)error_info.lines_in_batch;
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,lVar1,((long *)error_info.lines_in_batch)[1] + lVar1);
  local_390 = options;
  iStack_388 = error_info.boundary_idx;
  optional_idx::optional_idx(&local_398,(idx_t)csv_row);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = iStack_388;
  error_info_p.boundary_idx = (idx_t)local_390;
  CSVError(__return_storage_ptr__,&local_360,MAXIMUM_LINE_SIZE,0,&local_380,error_info_p,
           (idx_t)csv_row,local_398,(CSVReaderOptions *)this,&local_340,(string *)byte_position);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_320);
  ::std::ios_base::~ios_base(local_2b0);
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::LineSizeError(const CSVReaderOptions &options, LinesPerBoundary error_info, string &csv_row,
                                 idx_t byte_position, const string &current_path) {
	std::ostringstream error;
	error << "Maximum line size of " << options.maximum_line_size.GetValue() << " bytes exceeded. ";
	error << "Actual Size:" << csv_row.size() << " bytes." << '\n';

	std::ostringstream how_to_fix_it;
	how_to_fix_it << "Possible Solution: Change the maximum length size, e.g., max_line_size=" << csv_row.size() + 2
	              << "\n";

	return CSVError(error.str(), MAXIMUM_LINE_SIZE, 0, csv_row, error_info, byte_position, byte_position, options,
	                how_to_fix_it.str(), current_path);
}